

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlmder1c.c
# Opt level: O0

int fcn(void *p,int m,int n,double *x,double *fvec,double *fjac,int ldfjac,int iflag)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_70;
  double local_68;
  double *y;
  double tmp4;
  double tmp3;
  double tmp2;
  double tmp1;
  int i;
  double *fjac_local;
  double *fvec_local;
  double *x_local;
  int n_local;
  int m_local;
  void *p_local;
  
  lVar1 = *(long *)((long)p + 8);
  if (iflag != 0) {
    if (iflag == 2) {
      for (i = 0; i < 0xf; i = i + 1) {
        dVar2 = (double)(i + 1);
        dVar3 = (double)(0xf - i);
        local_70 = dVar2;
        if (7 < i) {
          local_70 = dVar3;
        }
        dVar4 = x[1] * dVar3 + x[2] * local_70;
        dVar4 = dVar4 * dVar4;
        fjac[i] = -1.0;
        fjac[i + ldfjac] = (dVar2 * dVar3) / dVar4;
        fjac[i + ldfjac * 2] = (dVar2 * local_70) / dVar4;
      }
    }
    else {
      for (i = 0; i < 0xf; i = i + 1) {
        local_68 = (double)(i + 1);
        if (7 < i) {
          local_68 = (double)(0xf - i);
        }
        fvec[i] = *(double *)(lVar1 + (long)i * 8) -
                  (*x + (double)(i + 1) / (x[1] * (double)(0xf - i) + x[2] * local_68));
      }
    }
  }
  return 0;
}

Assistant:

int fcn(void *p, int m, int n, const real *x, real *fvec, real *fjac, 
	 int ldfjac, int iflag)
{

/*      subroutine fcn for lmder1 example. */

  int i;
  real tmp1, tmp2, tmp3, tmp4;
  const real *y = ((fcndata_t*)p)->y;
  assert(m == 15 && n == 3);

  if (iflag == 0) {
    /*      insert print statements here when nprint is positive. */
    /* if the nprint parameter to lmder is positive, the function is
       called every nprint iterations with iflag=0, so that the
       function may perform special operations, such as printing
       residuals. */
    return 0;
  }

  if (iflag != 2) {
    /* compute residuals */
    for (i=0; i < 15; ++i) {
      tmp1 = i + 1;
      tmp2 = 15 - i;
      tmp3 = (i > 7) ? tmp2 : tmp1;
      fvec[i] = y[i] - (x[0] + tmp1/(x[1]*tmp2 + x[2]*tmp3));
    }
  } else {
    /* compute Jacobian */
    for (i=0; i<15; ++i) {
      tmp1 = i + 1;
      tmp2 = 15 - i;
      tmp3 = (i > 7) ? tmp2 : tmp1;
      tmp4 = (x[1]*tmp2 + x[2]*tmp3); tmp4 = tmp4*tmp4;
      fjac[i + ldfjac*0] = -1.;
      fjac[i + ldfjac*1] = tmp1*tmp2/tmp4;
      fjac[i + ldfjac*2] = tmp1*tmp3/tmp4;
    };
  }
  return 0;
}